

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O1

Cec3_Man_t * Cec3_ManCreate(Gia_Man_t *pAig,Cec3_Par_t *pPars)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Cec3_Man_t *__s;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  bmcg_sat_solver *pbVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Vec_Int_t *pVVar11;
  abctime aVar12;
  long lVar13;
  timespec ts;
  timespec local_40;
  
  __s = (Cec3_Man_t *)calloc(1,0xa0);
  memset(__s,0,0xa0);
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    aVar12 = -1;
  }
  else {
    aVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  __s->timeStart = aVar12;
  __s->pPars = pPars;
  __s->pAig = pAig;
  p = Gia_ManStart(pAig->nObjs);
  __s->pNew = p;
  Gia_ManFillValue(pAig);
  pAig->pObjs->Value = 0;
  pVVar11 = pAig->vCis;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar13];
      if (((long)iVar5 < 0) || (pAig->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pAig->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p);
      uVar3 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar6 < pGVar4) || (pGVar4 + p->nObjs <= pGVar6)) {
LAB_00651f60:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p->pObjs;
      if ((pGVar6 < pGVar4) || (pGVar4 + p->nObjs <= pGVar6)) goto LAB_00651f60;
      pGVar2[iVar5].Value = (int)((ulong)((long)pGVar6 - (long)pGVar4) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      pVVar11 = pAig->vCis;
    } while (lVar13 < pVVar11->nSize);
  }
  Gia_ManHashAlloc(p);
  uVar1 = p->nObjs;
  if ((p->vCopies2).nCap < (int)uVar1) {
    piVar7 = (p->vCopies2).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar1 << 2);
    }
    (p->vCopies2).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies2).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies2).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vCopies2).nSize = uVar1;
  pbVar8 = bmcg_sat_solver_start();
  __s->pSat = pbVar8;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(8000);
  pVVar9->pArray = ppvVar10;
  __s->vFrontier = pVVar9;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar9->pArray = ppvVar10;
  __s->vFanins = pVVar9;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar11->pArray = piVar7;
  __s->vNodesNew = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar11->pArray = piVar7;
  __s->vSatVars = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar11->pArray = piVar7;
  __s->vObjSatPairs = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar11->pArray = piVar7;
  __s->vCexTriples = pVVar11;
  pAig->pData = pbVar8;
  return __s;
}

Assistant:

Cec3_Man_t * Cec3_ManCreate( Gia_Man_t * pAig, Cec3_Par_t * pPars )
{
    Cec3_Man_t * p;
    Gia_Obj_t * pObj; int i;
    //satoko_opts_t Pars;
    //assert( Gia_ManRegNum(pAig) == 0 );
    p = ABC_CALLOC( Cec3_Man_t, 1 );
    memset( p, 0, sizeof(Cec3_Man_t) );
    p->timeStart    = Abc_Clock();
    p->pPars        = pPars;
    p->pAig         = pAig;
    // create new manager
    p->pNew         = Gia_ManStart( Gia_ManObjNum(pAig) );
    Gia_ManFillValue( pAig );
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_ManAppendCi( p->pNew );
    Gia_ManHashAlloc( p->pNew );
    Vec_IntFill( &p->pNew->vCopies2, Gia_ManObjNum(p->pNew), -1 );
    // SAT solving
    //memset( &Pars, 0, sizeof(satoko_opts_t) );
    p->pSat         = bmcg_sat_solver_start();
    p->vFrontier    = Vec_PtrAlloc( 1000 );
    p->vFanins      = Vec_PtrAlloc( 100 );
    p->vNodesNew    = Vec_IntAlloc( 100 );
    p->vSatVars     = Vec_IntAlloc( 100 );
    p->vObjSatPairs = Vec_IntAlloc( 100 );
    p->vCexTriples  = Vec_IntAlloc( 100 );
    //Pars.conf_limit = pPars->nConfLimit;
    //satoko_configure(p->pSat, &Pars);
    // remember pointer to the solver in the AIG manager
    pAig->pData     = p->pSat;
    return p;
}